

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

int mcpl2ssw_app(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long surface_id;
  long nparticles_limit;
  char *outsswfile;
  char *refsswfile;
  char *inmcplfile;
  long local_28;
  long local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  iVar1 = mcpl2ssw_parse_args(argc,argv,&local_8,&local_10,&local_18,&local_20,&local_28);
  iVar2 = 0;
  if ((iVar1 != -1) && (iVar2 = iVar1, iVar1 == 0)) {
    mcpl2ssw(local_8,local_18,local_10,local_28,local_20);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mcpl2ssw_app( int argc, char** argv ) {

  const char * inmcplfile;
  const char * refsswfile;
  const char * outsswfile;
  long nparticles_limit;
  long surface_id;

  int parse = mcpl2ssw_parse_args( argc, (const char**)argv,
                                   &inmcplfile, &refsswfile, &outsswfile,
                                   &nparticles_limit, &surface_id );

  if (parse==-1)// --help
    return 0;

  if (parse)// parse error
    return parse;

  if (mcpl2ssw(inmcplfile, outsswfile, refsswfile,surface_id, nparticles_limit))
    return 0;

  return 1;

}